

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_utility.cpp
# Opt level: O2

void R_RebuildViewInterpolation(player_t *player)

{
  AActor *pAVar1;
  InterpolationViewer *pIVar2;
  
  if (player != (player_t *)0x0) {
    pAVar1 = GC::ReadBarrier<AActor>((AActor **)&player->camera);
    if ((pAVar1 != (AActor *)0x0) && (NoInterpolateView == true)) {
      NoInterpolateView = false;
      pAVar1 = GC::ReadBarrier<AActor>((AActor **)&player->camera);
      pIVar2 = FindPastViewer(pAVar1);
      InterpolationViewer::instance::operator=(&pIVar2->Old,&pIVar2->New);
      TArray<DVector3a,_DVector3a>::Clear(&InterpolationPath);
      return;
    }
  }
  return;
}

Assistant:

void R_RebuildViewInterpolation(player_t *player)
{
	if (player == NULL || player->camera == NULL)
		return;

	if (!NoInterpolateView)
		return;
	NoInterpolateView = false;

	InterpolationViewer *iview = FindPastViewer(player->camera);

	iview->Old = iview->New;
	InterpolationPath.Clear();
}